

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_rope(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  
  gVar1 = dst->src[0]->type;
  if (gVar1 == GGML_TYPE_F32) {
    ggml_compute_forward_rope_f32(params,dst,true);
    return;
  }
  if (gVar1 == GGML_TYPE_F16) {
    ggml_compute_forward_rope_f16(params,dst,true);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1563,"fatal error");
}

Assistant:

void ggml_compute_forward_rope(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_rope_f16(params, dst, true);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_rope_f32(params, dst, true);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}